

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O2

void k053260_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  if (((*(byte *)((long)param + 0x25) & 2) == 0) || (*(long *)((long)param + 200) == 0)) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  uVar7 = 0;
  do {
    if (uVar7 == samples) {
      return;
    }
    uVar8 = *(long *)((long)param + 0xe0) + *(long *)((long)param + 0xd8);
    *(ulong *)((long)param + 0xe0) = uVar8 & 0xffffffff;
    iVar6 = 0;
    iVar12 = 0;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      if ((*(char *)((long)param + lVar11 * 0x28 + 0x3f) != '\0') &&
         (plVar9 = (long *)((long)param + lVar11 * 0x28 + 0x28),
         *(char *)((long)plVar9 + 0x25) == '\0')) {
        iVar10 = *(int *)((long)plVar9 + 0x14) + (int)(uVar8 >> 0x20);
        if ((short)*(int *)((long)plVar9 + 0x14) == -1) {
          iVar10 = 0x1000;
        }
        *(short *)((long)plVar9 + 0x14) = (short)iVar10;
        while (0xfff < (ushort)iVar10) {
          iVar10 = (ushort)((ushort)iVar10 + *(short *)((long)plVar9 + 0x1e)) - 0x1000;
          *(short *)((long)plVar9 + 0x14) = (short)iVar10;
          uVar3 = (int)plVar9[1] + 1;
          *(uint *)(plVar9 + 1) = uVar3;
          cVar1 = *(char *)((long)plVar9 + 0x23);
          uVar5 = uVar3 >> (cVar1 != '\0');
          if ((int)(uint)*(ushort *)((long)plVar9 + 0x1c) < (int)uVar5) {
            if (*(char *)((long)plVar9 + 0x22) == '\0') {
              *(undefined1 *)((long)plVar9 + 0x17) = 0;
              goto LAB_0015231a;
            }
            *(undefined1 *)((long)plVar9 + 0x16) = 0;
            *(undefined4 *)(plVar9 + 1) = 0;
            uVar3 = 0;
            uVar5 = 0 >> (cVar1 != '\0');
          }
          uVar2 = -uVar5;
          if (*(char *)((long)plVar9 + 0x24) == '\0') {
            uVar2 = uVar5;
          }
          bVar4 = *(byte *)(*(long *)(*plVar9 + 200) +
                           (ulong)(uVar2 + (int)plVar9[3] & *(uint *)(*plVar9 + 0xd4)));
          if (cVar1 != '\0') {
            bVar4 = *(char *)((long)plVar9 + 0x16) +
                    KDSC_play_kadpcm_table[bVar4 >> (((byte)uVar3 & 1) << 2) & 0xf];
          }
          *(byte *)((long)plVar9 + 0x16) = bVar4;
        }
        iVar12 = iVar12 + (*(int *)((long)plVar9 + 0xc) * (int)*(char *)((long)plVar9 + 0x16) >> 0xf
                          );
        iVar6 = iVar6 + ((int)*(char *)((long)plVar9 + 0x16) * (int)plVar9[2] >> 0xf);
      }
LAB_0015231a:
    }
    (*outputs)[uVar7] = iVar12;
    outputs[1][uVar7] = iVar6;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void k053260_update(void* param, UINT32 samples, DEV_SMPL **outputs)
{
	k053260_state *info = (k053260_state *)param;

	if ((info->mode & 2) && info->rom != NULL)
	{
		UINT32 i, j;

		for (j = 0; j < samples; j++)
		{
			DEV_SMPL buffer[2] = {0, 0};
			UINT16 cycles;

			RC_STEP(&info->cycleCntr);
			cycles = (UINT16)RC_GET_VAL(&info->cycleCntr);
			RC_MASK(&info->cycleCntr);

			for ( i = 0; i < 4; i++ )
			{
				if (info->voice[i].playing && !info->voice[i].Muted)
					KDSC_play(&info->voice[i], buffer, cycles);
			}

			outputs[0][j] = buffer[0];
			outputs[1][j] = buffer[1];
		}
	}
	else
	{
		memset( outputs[0], 0, samples * sizeof(*outputs[0]));
		memset( outputs[1], 0, samples * sizeof(*outputs[1]));
	}
}